

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Induction.cpp
# Opt level: O0

void __thiscall
Inferences::InductionClauseIterator::performIntInduction
          (InductionClauseIterator *this,InductionContext *context,Entry *e,bool increasing,
          Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
          bound1,TermLiteralClause *optionalBound2)

{
  initializer_list<Kernel::TermList> __l;
  initializer_list<Kernel::TermList> __l_00;
  initializer_list<Kernel::TermList> __l_01;
  initializer_list<Kernel::TermList> __l_02;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Formula *pFVar4;
  Entry *pEVar5;
  BinaryFormula *this_00;
  void *pvVar6;
  byte in_CL;
  uint64_t *in_R8;
  ClauseStack cls;
  InferenceRule rule;
  Formula *hyp;
  Formula *Lycompb2;
  bool isBound2FirstArg;
  bool isBound2Equal;
  Formula *Lxcompb2;
  TermList b2;
  bool hasBound2;
  bool isDefaultBound;
  Formula *FyInterval;
  Formula *FxInterval;
  Formula *Lycompb1;
  bool isBound1FirstArg;
  bool isBound1Equal;
  Formula *Lxcompb1;
  Formula *Lxpo;
  TermList fpo;
  Formula *Ly;
  Substitution subst;
  Formula *Lx;
  Formula *Lb1;
  TermList y;
  TermList x;
  TermList one;
  TermList b1;
  undefined1 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb69;
  undefined1 in_stack_fffffffffffffb6a;
  undefined1 in_stack_fffffffffffffb6b;
  undefined1 in_stack_fffffffffffffb6c;
  undefined1 in_stack_fffffffffffffb6d;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  Signature *in_stack_fffffffffffffb70;
  List<Kernel::Formula_*> *in_stack_fffffffffffffb78;
  Connective con;
  BinaryFormula *in_stack_fffffffffffffb80;
  TermList in_stack_fffffffffffffb88;
  TermList in_stack_fffffffffffffb90;
  allocator_type *in_stack_fffffffffffffb98;
  Theory *in_stack_fffffffffffffba0;
  iterator in_stack_fffffffffffffba8;
  size_type in_stack_fffffffffffffbb0;
  Substitution *in_stack_fffffffffffffbf0;
  ClauseStack *in_stack_fffffffffffffbf8;
  Entry *in_stack_fffffffffffffc00;
  uint in_stack_fffffffffffffc30;
  uint in_stack_fffffffffffffc34;
  bool local_3bd;
  Substitution *in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc64;
  undefined1 opposite;
  vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *in_stack_fffffffffffffc68;
  undefined5 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  TermList *local_380;
  TermList *local_378;
  TermList *local_350;
  TermList *local_348;
  TermList local_218;
  undefined1 local_20a;
  undefined1 local_209;
  Substitution *local_208;
  Entry *local_200;
  uint64_t local_1f8;
  uint64_t local_1f0;
  Substitution *local_1e8;
  byte local_1dc;
  undefined1 local_1d9;
  uint64_t local_1d8;
  uint64_t local_1d0;
  Entry *local_1c8;
  undefined8 local_1b8;
  undefined8 *local_1b0;
  undefined8 local_1a8;
  Formula *local_188;
  undefined8 local_180;
  uint64_t local_178;
  undefined8 local_170;
  DHMap<unsigned_int,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffffe98;
  InductionContext *context_00;
  InferenceRule rule_00;
  Formula *hypothesis;
  InductionClauseIterator *in_stack_fffffffffffffeb8;
  uint64_t local_f8;
  uint64_t *local_f0;
  undefined8 local_e8;
  Formula *local_c8;
  uint64_t local_b8;
  uint64_t *local_b0;
  undefined8 local_a8;
  Formula *local_88;
  TermList local_80;
  TermList local_78 [5];
  undefined8 local_50;
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>_conflict25
  local_40;
  TermList local_30;
  uint64_t *local_28;
  byte local_19;
  
  opposite = (undefined1)((uint)in_stack_fffffffffffffc64 >> 0x18);
  local_19 = in_CL & 1;
  local_28 = in_R8;
  local_40 = Lib::
             Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>
             ::
             apply<Inferences::InductionClauseIterator::performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)::__0>
                       ();
  local_30._content = local_40.super_TermList._content;
  Kernel::IntegerConstantType::IntegerConstantType
            ((IntegerConstantType *)in_stack_fffffffffffffb80,
             (int)((ulong)in_stack_fffffffffffffb78 >> 0x20));
  Kernel::Theory::representConstant
            (in_stack_fffffffffffffba0,(IntegerConstantType *)in_stack_fffffffffffffb98);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffb70,
             (Term *)CONCAT17(in_stack_fffffffffffffb6f,
                              CONCAT16(in_stack_fffffffffffffb6e,
                                       CONCAT15(in_stack_fffffffffffffb6d,
                                                CONCAT14(in_stack_fffffffffffffb6c,
                                                         CONCAT13(in_stack_fffffffffffffb6b,
                                                                  CONCAT12(in_stack_fffffffffffffb6a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  Kernel::IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x7ce084);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffb70,
             CONCAT13(in_stack_fffffffffffffb6f,
                      CONCAT12(in_stack_fffffffffffffb6e,
                               CONCAT11(in_stack_fffffffffffffb6d,in_stack_fffffffffffffb6c))),
             (bool)in_stack_fffffffffffffb6b);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffb70,
             CONCAT13(in_stack_fffffffffffffb6f,
                      CONCAT12(in_stack_fffffffffffffb6e,
                               CONCAT11(in_stack_fffffffffffffb6d,in_stack_fffffffffffffb6c))),
             (bool)in_stack_fffffffffffffb6b);
  local_b8 = local_30._content;
  local_b0 = &local_b8;
  local_a8 = 1;
  std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7ce106);
  __l._M_len = in_stack_fffffffffffffbb0;
  __l._M_array = in_stack_fffffffffffffba8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffba0,__l,in_stack_fffffffffffffb98);
  pFVar4 = InductionContext::getFormula
                     ((InductionContext *)
                      CONCAT17(in_stack_fffffffffffffc77,
                               CONCAT16(in_stack_fffffffffffffc76,
                                        CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70
                                                ))),in_stack_fffffffffffffc68,(bool)opposite,
                      in_stack_fffffffffffffc58);
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffb80);
  std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7ce16f);
  local_f8 = local_78[0]._content;
  local_f0 = &local_f8;
  local_e8 = 1;
  local_88 = pFVar4;
  std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7ce1d0);
  __l_00._M_len = in_stack_fffffffffffffbb0;
  __l_00._M_array = in_stack_fffffffffffffba8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffba0,__l_00,in_stack_fffffffffffffb98);
  pFVar4 = InductionContext::getFormula
                     ((InductionContext *)
                      CONCAT17(in_stack_fffffffffffffc77,
                               CONCAT16(in_stack_fffffffffffffc76,
                                        CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70
                                                ))),in_stack_fffffffffffffc68,(bool)opposite,
                      in_stack_fffffffffffffc58);
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffb80);
  std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7ce239);
  local_c8 = pFVar4;
  Kernel::Substitution::Substitution((Substitution *)0x7ce256);
  rule_00 = (InferenceRule)((ulong)&stack0xfffffffffffffea0 >> 0x38);
  hypothesis = (Formula *)0x1;
  std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7ce2a7);
  __l_01._M_len = in_stack_fffffffffffffbb0;
  __l_01._M_array = in_stack_fffffffffffffba8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffba0,__l_01,in_stack_fffffffffffffb98);
  InductionContext::getFormula
            ((InductionContext *)
             CONCAT17(in_stack_fffffffffffffc77,
                      CONCAT16(in_stack_fffffffffffffc76,
                               CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70))),
             in_stack_fffffffffffffc68,(bool)opposite,in_stack_fffffffffffffc58);
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffb80);
  std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7ce314);
  Kernel::Signature::getInterpretingSymbol
            (in_stack_fffffffffffffb70,
             CONCAT13(in_stack_fffffffffffffb6f,
                      CONCAT12(in_stack_fffffffffffffb6e,
                               CONCAT11(in_stack_fffffffffffffb6d,in_stack_fffffffffffffb6c))));
  local_178 = local_78[0]._content;
  local_180 = local_50;
  Kernel::Term::create2
            ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffb70,
             (Term *)CONCAT17(in_stack_fffffffffffffb6f,
                              CONCAT16(in_stack_fffffffffffffb6e,
                                       CONCAT15(in_stack_fffffffffffffb6d,
                                                CONCAT14(in_stack_fffffffffffffb6c,
                                                         CONCAT13(in_stack_fffffffffffffb6b,
                                                                  CONCAT12(in_stack_fffffffffffffb6a
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  local_1b8 = local_170;
  local_1b0 = &local_1b8;
  local_1a8 = 1;
  std::allocator<Kernel::TermList>::allocator((allocator<Kernel::TermList> *)0x7ce3f0);
  __l_02._M_len = in_stack_fffffffffffffbb0;
  __l_02._M_array = in_stack_fffffffffffffba8;
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffba0,__l_02,in_stack_fffffffffffffb98);
  pFVar4 = InductionContext::getFormula
                     ((InductionContext *)
                      CONCAT17(in_stack_fffffffffffffc77,
                               CONCAT16(in_stack_fffffffffffffc76,
                                        CONCAT15(in_stack_fffffffffffffc75,in_stack_fffffffffffffc70
                                                ))),in_stack_fffffffffffffc68,(bool)opposite,
                      in_stack_fffffffffffffc58);
  std::vector<Kernel::TermList,_std::allocator<Kernel::TermList>_>::~vector
            ((vector<Kernel::TermList,_std::allocator<Kernel::TermList>_> *)
             in_stack_fffffffffffffb80);
  std::allocator<Kernel::TermList>::~allocator((allocator<Kernel::TermList> *)0x7ce459);
  local_188 = pFVar4;
  context_00 = (InductionContext *)local_80._content;
  if ((performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
       ::less == '\0') &&
     (iVar2 = __cxa_guard_acquire(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                                   ::less), context_00 = (InductionContext *)local_80._content,
     iVar2 != 0)) {
    performIntInduction::less =
         Kernel::Signature::getInterpretingSymbol
                   (in_stack_fffffffffffffb70,
                    CONCAT13(in_stack_fffffffffffffb6f,
                             CONCAT12(in_stack_fffffffffffffb6e,
                                      CONCAT11(in_stack_fffffffffffffb6d,in_stack_fffffffffffffb6c))
                            ));
    __cxa_guard_release(&performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)
                         ::less);
    context_00 = (InductionContext *)local_80._content;
  }
  local_1c8 = (Entry *)Kernel::AtomicFormula::operator_new(0x7ce4c4);
  if ((local_19 & 1) == 0) {
    local_348 = &local_30;
  }
  else {
    local_348 = local_78;
  }
  local_1d0 = local_348->_content;
  if ((local_19 & 1) == 0) {
    local_350 = local_78;
  }
  else {
    local_350 = &local_30;
  }
  local_1d8 = local_350->_content;
  Kernel::Literal::create2
            ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffb80 >> 0x18,0),in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  Kernel::AtomicFormula::AtomicFormula
            ((AtomicFormula *)in_stack_fffffffffffffb70,
             (Literal *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,
                               CONCAT15(in_stack_fffffffffffffb6d,
                                        CONCAT14(in_stack_fffffffffffffb6c,
                                                 CONCAT13(in_stack_fffffffffffffb6b,
                                                          CONCAT12(in_stack_fffffffffffffb6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  local_1d9 = Lib::
              Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>
              ::
              match<Inferences::InductionClauseIterator::performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)::__1,Inferences::InductionClauseIterator::performIntInduction(Inferences::InductionContext_const&,Indexing::InductionFormulaIndex::Entry*,bool,Lib::Coproduct<Indexing::TermLiteralClause,Inferences::InductionClauseIterator::DefaultBound>,Indexing::TermLiteralClause_const*)::__2>
                        ((Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
                          *)&stack0x00000008);
  local_1dc = (local_19 & 1) != local_1d9;
  local_1e8 = (Substitution *)Kernel::AtomicFormula::operator_new(0x7ce5fc);
  if ((local_1dc & 1) == 0) {
    local_378 = &local_80;
  }
  else {
    local_378 = &local_30;
  }
  local_1f0 = local_378->_content;
  if ((local_1dc & 1) == 0) {
    local_380 = &local_30;
  }
  else {
    local_380 = &local_80;
  }
  local_1f8 = local_380->_content;
  Kernel::Literal::create2
            ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffb80 >> 0x18,0),in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb88);
  Kernel::AtomicFormula::AtomicFormula
            ((AtomicFormula *)in_stack_fffffffffffffb70,
             (Literal *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,
                               CONCAT15(in_stack_fffffffffffffb6d,
                                        CONCAT14(in_stack_fffffffffffffb6c,
                                                 CONCAT13(in_stack_fffffffffffffb6b,
                                                          CONCAT12(in_stack_fffffffffffffb6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  local_209 = Lib::
              Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
              ::is<Inferences::InductionClauseIterator::DefaultBound>
                        ((Coproduct<Indexing::TermLiteralClause,_Inferences::InductionClauseIterator::DefaultBound>
                          *)0x7ce70c);
  local_20a = false;
  if (local_28 != (uint64_t *)0x0) {
    local_20a = local_28[2] != 0;
  }
  if ((bool)local_20a == false) {
    local_200 = local_1c8;
    local_208 = local_1e8;
  }
  else {
    local_218._content = *local_28;
    bVar1 = Kernel::TermList::operator==(&local_30,&local_218);
    if (bVar1) goto LAB_007cf07d;
    Kernel::AtomicFormula::operator_new(0x7ce9a7);
    Kernel::Literal::create2
              ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb80 >> 0x18,0),in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffb70,
               (Literal *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,
                                 CONCAT15(in_stack_fffffffffffffb6d,
                                          CONCAT14(in_stack_fffffffffffffb6c,
                                                   CONCAT13(in_stack_fffffffffffffb6b,
                                                            CONCAT12(in_stack_fffffffffffffb6a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
    uVar3 = Kernel::Term::functor((Term *)local_28[2]);
    local_3bd = false;
    if (uVar3 == performIntInduction::less) {
      local_3bd = Kernel::Literal::isNegative((Literal *)0x7cead5);
    }
    Kernel::AtomicFormula::operator_new(0x7ceb28);
    in_stack_fffffffffffffc34 = CONCAT13(local_3bd,(int3)in_stack_fffffffffffffc34) ^ 0xff000000;
    in_stack_fffffffffffffc30 = performIntInduction::less;
    Kernel::Literal::create2
              ((uint)((ulong)in_stack_fffffffffffffb80 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffb80 >> 0x18,0),in_stack_fffffffffffffb90,
               in_stack_fffffffffffffb88);
    Kernel::AtomicFormula::AtomicFormula
              ((AtomicFormula *)in_stack_fffffffffffffb70,
               (Literal *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,
                                 CONCAT15(in_stack_fffffffffffffb6d,
                                          CONCAT14(in_stack_fffffffffffffb6c,
                                                   CONCAT13(in_stack_fffffffffffffb6b,
                                                            CONCAT12(in_stack_fffffffffffffb6a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
    pEVar5 = (Entry *)Kernel::JunctionFormula::operator_new(0x7cec35);
    in_stack_fffffffffffffc00 = local_1c8;
    Lib::List<Kernel::Formula_*>::singleton(&in_stack_fffffffffffffb80->super_Formula);
    in_stack_fffffffffffffbf8 =
         (ClauseStack *)
         Lib::List<Kernel::Formula_*>::cons
                   (&in_stack_fffffffffffffb80->super_Formula,in_stack_fffffffffffffb78);
    Kernel::JunctionFormula::JunctionFormula
              ((JunctionFormula *)in_stack_fffffffffffffb80,
               (Connective)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               (FormulaList *)in_stack_fffffffffffffb70);
    local_200 = pEVar5;
    in_stack_fffffffffffffbf0 = (Substitution *)Kernel::JunctionFormula::operator_new(0x7cecbb);
    Lib::List<Kernel::Formula_*>::singleton(&in_stack_fffffffffffffb80->super_Formula);
    Lib::List<Kernel::Formula_*>::cons
              (&in_stack_fffffffffffffb80->super_Formula,in_stack_fffffffffffffb78);
    Kernel::JunctionFormula::JunctionFormula
              ((JunctionFormula *)in_stack_fffffffffffffb80,
               (Connective)((ulong)in_stack_fffffffffffffb78 >> 0x20),
               (FormulaList *)in_stack_fffffffffffffb70);
    local_208 = in_stack_fffffffffffffbf0;
  }
  Kernel::BinaryFormula::operator_new(0x7cee06);
  Kernel::JunctionFormula::operator_new(0x7cee17);
  Kernel::BinaryFormula::operator_new(0x7cee35);
  Kernel::JunctionFormula::operator_new(0x7cee46);
  Lib::List<Kernel::Formula_*>::singleton(&in_stack_fffffffffffffb80->super_Formula);
  Lib::List<Kernel::Formula_*>::cons
            (&in_stack_fffffffffffffb80->super_Formula,in_stack_fffffffffffffb78);
  Kernel::JunctionFormula::JunctionFormula
            ((JunctionFormula *)in_stack_fffffffffffffb80,
             (Connective)((ulong)in_stack_fffffffffffffb78 >> 0x20),
             (FormulaList *)in_stack_fffffffffffffb70);
  Kernel::BinaryFormula::BinaryFormula
            (in_stack_fffffffffffffb80,(Connective)((ulong)in_stack_fffffffffffffb78 >> 0x20),
             (Formula *)in_stack_fffffffffffffb70,
             (Formula *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,
                               CONCAT15(in_stack_fffffffffffffb6d,
                                        CONCAT14(in_stack_fffffffffffffb6c,
                                                 CONCAT13(in_stack_fffffffffffffb6b,
                                                          CONCAT12(in_stack_fffffffffffffb6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  Kernel::Formula::quantify
            ((Formula *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  Lib::List<Kernel::Formula_*>::singleton(&in_stack_fffffffffffffb80->super_Formula);
  this_00 = (BinaryFormula *)
            Lib::List<Kernel::Formula_*>::cons
                      (&in_stack_fffffffffffffb80->super_Formula,in_stack_fffffffffffffb78);
  Kernel::JunctionFormula::JunctionFormula
            ((JunctionFormula *)this_00,(Connective)((ulong)in_stack_fffffffffffffb78 >> 0x20),
             (FormulaList *)in_stack_fffffffffffffb70);
  pvVar6 = Kernel::BinaryFormula::operator_new(0x7cef10);
  con = (Connective)((ulong)pvVar6 >> 0x20);
  Kernel::BinaryFormula::BinaryFormula
            (this_00,con,(Formula *)in_stack_fffffffffffffb70,
             (Formula *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,
                               CONCAT15(in_stack_fffffffffffffb6d,
                                        CONCAT14(in_stack_fffffffffffffb6c,
                                                 CONCAT13(in_stack_fffffffffffffb6b,
                                                          CONCAT12(in_stack_fffffffffffffb6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  pFVar4 = Kernel::Formula::quantify
                     ((Formula *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  Kernel::BinaryFormula::BinaryFormula
            (this_00,con,pFVar4,
             (Formula *)
             CONCAT17(in_stack_fffffffffffffb6f,
                      CONCAT16(in_stack_fffffffffffffb6e,
                               CONCAT15(in_stack_fffffffffffffb6d,
                                        CONCAT14(in_stack_fffffffffffffb6c,
                                                 CONCAT13(in_stack_fffffffffffffb6b,
                                                          CONCAT12(in_stack_fffffffffffffb6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffb69,
                                                  in_stack_fffffffffffffb68))))))));
  produceClauses(in_stack_fffffffffffffeb8,hypothesis,rule_00,context_00,in_stack_fffffffffffffe98);
  Indexing::InductionFormulaIndex::Entry::add
            (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0);
  Lib::Stack<Kernel::Clause_*>::~Stack((Stack<Kernel::Clause_*> *)pFVar4);
LAB_007cf07d:
  Kernel::Substitution::~Substitution((Substitution *)0x7cf08a);
  return;
}

Assistant:

void InductionClauseIterator::performIntInduction(const InductionContext& context, InductionFormulaIndex::Entry* e, bool increasing, Coproduct<TermLiteralClause, DefaultBound> bound1, const TermLiteralClause* optionalBound2)
{
  TermList b1(bound1.apply([](auto x) { return x.term; }));
  TermList one(theory->representConstant(IntegerConstantType(increasing ? 1 : -1)));

  TermList x(0,false);
  TermList y(1,false);

  // create L[b1]
  Formula* Lb1 = context.getFormula({ b1 },true);

  // create L[X]
  Formula* Lx = context.getFormula({ x },true);

  // create L[Y]
  Substitution subst;
  Formula* Ly = context.getFormula({ y },true,&subst);

  // create L[X+1] or L[X-1]
  TermList fpo(Term::create2(env.signature->getInterpretingSymbol(Theory::INT_PLUS),x,one));
  Formula* Lxpo = context.getFormula({ fpo },true);

  static unsigned less = env.signature->getInterpretingSymbol(Theory::INT_LESS);
  // create X>=b1 (which is ~X<b1) or X<=b1 (which is ~b1<X)
  Formula* Lxcompb1 = new AtomicFormula(Literal::create2(less,false,(increasing ? x : b1),(increasing ? b1 : x)));
  // create Y>=b1 (which is ~Y<b1), or Y>b1, or Y<=b1 (which is ~b1<Y), or Y<b1
  // This comparison is mirroring the structure of bound1.literal, which is "b1 <comparison> inductionTerm".
  // If bound1.literal is nullptr, we are using the default bound with the comparison sign >= or <=.
  const bool isBound1Equal = bound1.match(
      [](TermLiteralClause const& bound1) { return (bound1.literal->functor() == less && bound1.literal->isNegative()); },
      [](DefaultBound) { return true; });
  const bool isBound1FirstArg = (increasing != isBound1Equal);
  Formula* Lycompb1 = new AtomicFormula(Literal::create2(
        less, !isBound1Equal, (isBound1FirstArg ? b1 : y), (isBound1FirstArg ? y : b1)));

  Formula* FxInterval;
  Formula* FyInterval;
  const bool isDefaultBound = bound1.template is<DefaultBound>();
  const bool hasBound2 = ((optionalBound2 != nullptr) && (optionalBound2->literal != nullptr));
  // Also resolve the hypothesis with comparisons with bound(s) (if the bound(s) are present/not default).
  if (hasBound2) {
    // Finite interval induction, use two bounds on both x and y.
    TermList b2(optionalBound2->term);
    if (b1 == b2) {
      return;
    }
    // create X<b2 or X>b2 (which is b2<X)
    Formula* Lxcompb2 = new AtomicFormula(Literal::create2(less, true, (increasing ? x : b2), (increasing ? b2 : x)));
    const bool isBound2Equal = (optionalBound2->literal->functor() == less && optionalBound2->literal->isNegative());
    const bool isBound2FirstArg = (increasing == isBound2Equal);
    // create Y<b2, or Y<=b2 (which is ~b2<Y) or Y>b2, or Y>=b2 (which is ~Y<b2)
    Formula* Lycompb2 = new AtomicFormula(Literal::create2(
          less, !isBound2Equal, (isBound2FirstArg ? b2 : y), (isBound2FirstArg ? y : b2)));
    FxInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lxcompb1, FormulaList::singleton(Lxcompb2)));
    FyInterval = new JunctionFormula(Connective::AND, FormulaList::cons(Lycompb1, FormulaList::singleton(Lycompb2)));
  } else {
    // Infinite interval induction (either with default bound or not), use only one bound on both x and y.
    FxInterval = Lxcompb1;
    FyInterval = Lycompb1;
  }

  // Create the hypothesis, with FxInterval and FyInterval being as described
  // in the comment above this function.
  Formula* hyp = new BinaryFormula(Connective::IMP,
                   new JunctionFormula(Connective::AND,FormulaList::cons(Lb1,FormulaList::singleton(
                     Formula::quantify(new BinaryFormula(Connective::IMP,
                       new JunctionFormula(Connective::AND, FormulaList::cons(FxInterval,FormulaList::singleton(Lx))),
                       Lxpo))))),
                   Formula::quantify(new BinaryFormula(Connective::IMP,FyInterval,Ly)));

  InferenceRule rule =
      isDefaultBound
          ? (increasing ? InferenceRule::INT_DB_UP_INDUCTION_AXIOM : InferenceRule::INT_DB_DOWN_INDUCTION_AXIOM)
          : (increasing ? (hasBound2 ? InferenceRule::INT_FIN_UP_INDUCTION_AXIOM : InferenceRule::INT_INF_UP_INDUCTION_AXIOM)
                        : (hasBound2 ? InferenceRule::INT_FIN_DOWN_INDUCTION_AXIOM : InferenceRule::INT_INF_DOWN_INDUCTION_AXIOM));

  auto cls = produceClauses(hyp, rule, context);
  e->add(std::move(cls), std::move(subst));
}